

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double beta_cdf_inv(double cdf,double p,double q)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double b;
  double dVar8;
  double dVar9;
  double dVar10;
  double x;
  double local_48;
  
  if (p <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n",0x1c);
    pcVar2 = "  P <= 0.0\n";
  }
  else {
    if (0.0 < q) {
      if ((0.0 <= cdf) && (cdf <= 1.0)) {
        if ((cdf == 0.0) && (!NAN(cdf))) {
          return 0.0;
        }
        if ((cdf == 1.0) && (!NAN(cdf))) {
          return 1.0;
        }
        uVar3 = -(ulong)(0.5 < cdf);
        local_48 = p;
        if (0.5 < cdf) {
          cdf = 1.0 - cdf;
          local_48 = q;
        }
        b = (double)(~uVar3 & (ulong)q | uVar3 & (ulong)p);
        dVar4 = log(cdf * cdf);
        if (-0.0 < dVar4) {
          dVar4 = sqrt(-dVar4);
        }
        else {
          dVar4 = SQRT(-dVar4);
        }
        dVar4 = dVar4 - (dVar4 * 0.27061 + 2.30753) / ((dVar4 * 0.04481 + 0.99229) * dVar4 + 1.0);
        if ((local_48 <= 1.0) || (b <= 1.0)) {
          dVar5 = 1.0 / (b * 9.0);
          if (dVar5 < 0.0) {
            dVar7 = sqrt(dVar5);
          }
          else {
            dVar7 = SQRT(dVar5);
          }
          dVar4 = pow(dVar4 * dVar7 + (1.0 - dVar5),3.0);
          dVar4 = dVar4 * (b + b);
          if (dVar4 <= 0.0) {
            dVar4 = log((1.0 - cdf) * b);
            dVar4 = exp((dVar4 + 0.0) / b);
            dVar4 = 1.0 - dVar4;
          }
          else {
            dVar4 = (local_48 * 4.0 + b + b + -2.0) / dVar4;
            if (dVar4 <= 1.0) {
              dVar4 = log(cdf * local_48);
              dVar4 = exp((dVar4 + 0.0) / local_48);
            }
            else {
              dVar4 = -2.0 / (dVar4 + 1.0) + 1.0;
            }
          }
        }
        else {
          dVar7 = (dVar4 * dVar4 + -3.0) / 6.0;
          dVar10 = 1.0 / (local_48 + local_48 + -1.0);
          dVar9 = 1.0 / (b + b + -1.0);
          dVar8 = 2.0 / (dVar10 + dVar9);
          dVar5 = dVar8 + dVar7;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          dVar4 = (dVar4 * dVar5) / dVar8 -
                  (-2.0 / (dVar8 * 3.0) + dVar7 + 0.8333333333333334) * (dVar9 - dVar10);
          dVar4 = exp(dVar4 + dVar4);
          dVar4 = local_48 / (dVar4 * b + local_48);
        }
        dVar5 = 0.0001;
        if (0.0001 <= dVar4) {
          dVar5 = dVar4;
        }
        dVar4 = 0.9999;
        if (dVar5 <= 0.9999) {
          dVar4 = dVar5;
        }
        dVar5 = pow(cdf,0.2);
        dVar5 = r8_max(((-5.0 / local_48) / local_48 - 1.0 / dVar5) + -13.0,-37.0);
        dVar7 = pow(10.0,(double)(int)dVar5);
        dVar8 = 1.0;
        dVar9 = 1.0;
        dVar5 = 0.0;
LAB_001935d1:
        x = dVar4;
        dVar4 = beta_inc(local_48,b,x);
        dVar10 = log(x);
        dVar6 = log(1.0 - x);
        dVar10 = exp(dVar6 * (1.0 - b) + dVar10 * (1.0 - local_48) + 0.0);
        dVar10 = dVar10 * (dVar4 - cdf);
        if (dVar5 * dVar10 <= 0.0) {
          dVar8 = r8_max(dVar9,1e-37);
        }
        dVar5 = 1.0;
        do {
          dVar4 = dVar10 * dVar5;
          dVar9 = dVar4 * dVar4;
          if (((dVar9 < dVar8) && (dVar4 = x - dVar4, 0.0 <= dVar4)) && (dVar4 <= 1.0)) {
            if ((dVar8 <= dVar7) || (dVar10 * dVar10 <= dVar7)) goto LAB_0019373a;
            if (((dVar4 != 0.0) || (NAN(dVar4))) && ((dVar4 != 1.0 || (NAN(dVar4)))))
            goto LAB_00193724;
          }
          dVar5 = dVar5 / 3.0;
        } while( true );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n",0x1c);
      pcVar2 = "  CDF < 0.0 or 1.0 < CDF\n";
      lVar1 = 0x19;
      goto LAB_00193181;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n",0x1c);
    pcVar2 = "  Q <= 0.0\n";
  }
  lVar1 = 0xb;
LAB_00193181:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar1);
  return -1.0;
LAB_00193724:
  dVar5 = dVar10;
  if ((dVar4 == x) && (!NAN(dVar4) && !NAN(x))) {
LAB_0019373a:
    return (double)(~uVar3 & (ulong)x | (ulong)(1.0 - x) & uVar3);
  }
  goto LAB_001935d1;
}

Assistant:

double beta_cdf_inv ( double cdf, double p, double q )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 April 2013
//
//  Author:
//
//    Original FORTRAN77 version by GW Cran, KJ Martin, GE Thomas.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    GW Cran, KJ Martin, GE Thomas,
//    Remark AS R19 and Algorithm AS 109:
//    A Remark on Algorithms AS 63: The Incomplete Beta Integral
//    and AS 64: Inverse of the Incomplete Beta Integeral,
//    Applied Statistics,
//    Volume 26, Number 1, 1977, pages 111-114.
//
//  Parameters:
//
//    Input, double CDF, the value of the incomplete Beta
//    function.  0 <= CDF <= 1.
//
//    Input, double P, Q, the parameters of the incomplete
//    Beta function.
//
//    Output, double BETA_CDF_INV, the argument of the Beta CDF which 
//    produces the value CDF.
//
//  Local Parameters:
//
//    Local, double SAE, the most negative decimal exponent
//    which does not cause an underflow.
//
{
  double a;
  double acu;
  double adj;
  double beta_log = 0.0;
  double fpu;
  double g;
  double h;
  int iex;
  bool indx;
  double pp;
  double prev;
  double qq;
  double r;
  double s;
  double sae = -37.0;
  double sq;
  double t;
  double tx;
  double value;
  double w;
  double xin;
  double y;
  double yprev;

  fpu = pow ( 10.0, sae );
//
//  Test for admissibility of parameters.
//
  if ( p <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  P <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( q <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  Q <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0.0 or 1.0 < CDF\n";
    value = -1.0;
    return value;
  }
//
//  Return immediately if the answer is easy.
//
  if ( cdf == 0.0 )
  {
    value = 0.0;
    return value;
  }
  if ( cdf == 1.0 )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary.
//
  if ( 0.5 < cdf )
  {
    a = 1.0 - cdf;
    pp = q;
    qq = p;
    indx = true;
  }
  else
  {
    a = cdf;
    pp = p;
    qq = q;
    indx = false;
  }
//
//  Calculate the initial approximation.
//
  r = sqrt ( - log ( a * a ) );

  y = r - ( 2.30753 + 0.27061 * r ) 
    / ( 1.0 + ( 0.99229 + 0.04481 * r ) * r );

  if ( 1.0 < pp && 1.0 < qq )
  {
    r = ( y * y - 3.0 ) / 6.0;
    s = 1.0 / ( pp + pp - 1.0 );
    t = 1.0 / ( qq + qq - 1.0 );
    h = 2.0 / ( s + t );
    w = y * sqrt ( h + r ) / h - ( t - s ) 
      * ( r + 5.0 / 6.0 - 2.0 / ( 3.0 * h ) );
    value = pp / ( pp + qq * exp ( w + w ) );
  }
  else
  {
    r = qq + qq;
    t = 1.0 / ( 9.0 * qq );
    t = r * pow ( 1.0 - t + y * sqrt ( t ), 3 );

    if ( t <= 0.0 )
    {
      value = 1.0 - exp ( ( log ( ( 1.0 - a ) * qq ) + beta_log ) / qq );
    }
    else
    {
      t = ( 4.0 * pp + r - 2.0 ) / t;

      if ( t <= 1.0 )
      {
        value = exp ( ( log ( a * pp ) + beta_log ) / pp );
      }
      else
      {
        value = 1.0 - 2.0 / ( t + 1.0 );
      }
    }
  }
//
//  Solve for X by a modified Newton-Raphson method.
//
  r = 1.0 - pp;
  t = 1.0 - qq;
  yprev = 0.0;
  sq = 1.0;
  prev = 1.0;

  if ( value < 0.0001 )
  {
    value = 0.0001;
  }

  if ( 0.9999 < value )
  {
    value = 0.9999;
  }

  iex = r8_max ( - 5.0 / pp / pp - 1.0 / pow ( a, 0.2 ) - 13.0, sae );

  acu = pow ( 10.0, iex );

  for ( ; ; )
  {
    y = beta_inc ( pp, qq, value );

    xin = value;
    y = ( y - a ) * exp ( beta_log + r * log ( xin ) + t * log ( 1.0 - xin ) );

    if ( y * yprev <= 0.0 )
    {
      prev = r8_max ( sq, fpu );
    }

    g = 1.0;

    for ( ; ; )
    {
      for ( ; ; )
      {
        adj = g * y;
        sq = adj * adj;

        if ( sq < prev )
        {
          tx = value - adj;

          if ( 0.0 <= tx && tx <= 1.0 )
          {
            break;
          }
        }
        g = g / 3.0;
      }

      if ( prev <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( y * y <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( tx != 0.0 && tx != 1.0 )
      {
        break;
      }

      g = g / 3.0;
    }

    if ( tx == value )
    {
      break;
    }

    value = tx;
    yprev = y;
  }

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}